

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<QString> * __thiscall
QHash<QString,_QList<QString>_>::operator[](QHash<QString,_QList<QString>_> *this,QString *key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,QList<QString>>::tryEmplace_impl<QString_const&>(&local_28,this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QList<QString> *)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(ulong)(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
                    [(uint)local_28.iterator.i.bucket & 0x7f] * 3 + 1].storage.data + 8);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }